

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

QList<QRect> *
QMdi::MinOverlapPlacer::getCandidatePlacements(QSize *size,QList<QRect> *rects,QRect *domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  iterator __first;
  iterator iVar5;
  iterator iVar6;
  QPoint *this;
  const_iterator o;
  QList<QRect> *in_RDX;
  iterator in_RDI;
  long in_FS_OFFSET;
  int x;
  add_const_t<QList<int>_> *__range2;
  int y;
  add_const_t<QList<int>_> *__range1_1;
  QRect *rect;
  QList<QRect> *__range1;
  QList<QRect> *result;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<int> ylist;
  QList<int> xlist;
  int in_stack_fffffffffffffe48;
  parameter_type in_stack_fffffffffffffe4c;
  QList<QRect> *in_stack_fffffffffffffe50;
  iterator __first_00;
  undefined4 in_stack_fffffffffffffe70;
  QList<int> *in_stack_fffffffffffffe78;
  const_iterator in_stack_fffffffffffffea0;
  const_iterator in_stack_fffffffffffffea8;
  qsizetype in_stack_fffffffffffffeb8;
  const_iterator local_90;
  int *local_88;
  const_iterator local_80;
  const_iterator local_78;
  const_iterator local_70;
  const_iterator local_68;
  const_iterator local_60;
  const_iterator local_58;
  QRect *local_50;
  const_iterator local_48;
  const_iterator local_40;
  QList<int> local_38;
  QList<int> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.i = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI.i + 2) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(in_RDI.i + 4) = &DAT_aaaaaaaaaaaaaaaa;
  __first_00.i = in_RDI.i;
  QList<QRect>::QList((QList<QRect> *)0x60cbb6);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x60cbf0);
  QList<QRect>::size(in_RDX);
  QList<int>::reserve(in_stack_fffffffffffffe78,in_stack_fffffffffffffeb8);
  QRect::left((QRect *)0x60cc1e);
  __first.i = (int *)QList<int>::operator<<
                               ((QList<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  iVar2 = QRect::right((QRect *)0x60cc3f);
  QSize::width((QSize *)0x60cc50);
  QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x60cc9d);
  QList<QRect>::size(in_RDX);
  QList<int>::reserve((QList<int> *)__first.i,in_stack_fffffffffffffeb8);
  QRect::top((QRect *)0x60cccb);
  QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  iVar3 = QRect::bottom((QRect *)0x60cce7);
  iVar4 = QSize::height((QSize *)0x60ccf8);
  if (-1 < (iVar3 - iVar4) + 1) {
    QRect::bottom((QRect *)0x60cd15);
    QSize::height((QSize *)0x60cd26);
    QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  }
  local_40.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QRect>::begin(in_stack_fffffffffffffe50);
  local_48.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = QList<QRect>::end(in_stack_fffffffffffffe50);
  while( true ) {
    local_50 = local_48.i;
    bVar1 = QList<QRect>::const_iterator::operator!=(&local_40,local_48);
    if (!bVar1) break;
    QList<QRect>::const_iterator::operator*(&local_40);
    QRect::right((QRect *)0x60ce05);
    QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    QRect::bottom((QRect *)0x60ce24);
    QList<int>::operator<<((QList<int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    QList<QRect>::const_iterator::operator++(&local_40);
  }
  QList<int>::begin((QList<int> *)in_stack_fffffffffffffe50);
  QList<int>::end((QList<int> *)in_stack_fffffffffffffe50);
  std::sort<QList<int>::iterator>(__first_00,in_RDI);
  QList<int>::begin((QList<int> *)in_stack_fffffffffffffe50);
  QList<int>::end((QList<int> *)in_stack_fffffffffffffe50);
  iVar5.i._4_4_ = iVar2;
  iVar5.i._0_4_ = in_stack_fffffffffffffe70;
  iVar5 = std::unique<QList<int>::iterator>(__first,iVar5);
  QList<int>::const_iterator::const_iterator(&local_58,iVar5);
  iVar5 = QList<int>::end((QList<int> *)in_stack_fffffffffffffe50);
  QList<int>::const_iterator::const_iterator(&local_60,iVar5);
  QList<int>::erase((QList<int> *)CONCAT44(iVar2,in_stack_fffffffffffffe70),
                    in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  QList<int>::begin((QList<int> *)in_stack_fffffffffffffe50);
  QList<int>::end((QList<int> *)in_stack_fffffffffffffe50);
  std::sort<QList<int>::iterator>(__first_00,in_RDI);
  iVar5 = QList<int>::begin((QList<int> *)in_stack_fffffffffffffe50);
  QList<int>::end((QList<int> *)in_stack_fffffffffffffe50);
  iVar6.i._4_4_ = iVar2;
  iVar6.i._0_4_ = in_stack_fffffffffffffe70;
  iVar6 = std::unique<QList<int>::iterator>(__first,iVar6);
  QList<int>::const_iterator::const_iterator(&local_68,iVar6);
  iVar6 = QList<int>::end((QList<int> *)in_stack_fffffffffffffe50);
  QList<int>::const_iterator::const_iterator(&local_70,iVar6);
  QList<int>::erase((QList<int> *)CONCAT44(iVar2,in_stack_fffffffffffffe70),(const_iterator)iVar6.i,
                    in_stack_fffffffffffffea0);
  this = (QPoint *)QList<int>::size(&local_38);
  QList<int>::size(&local_20);
  QList<QRect>::reserve((QList<QRect> *)__first.i,(qsizetype)iVar5.i);
  local_78.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = QList<int>::begin((QList<int> *)this);
  local_80.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_80 = QList<int>::end((QList<int> *)this);
  while( true ) {
    local_88 = local_80.i;
    bVar1 = QList<int>::const_iterator::operator!=(&local_78,local_80);
    if (!bVar1) break;
    QList<int>::const_iterator::operator*(&local_78);
    local_90.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = QList<int>::begin((QList<int> *)this);
    o = QList<int>::end((QList<int> *)this);
    while (bVar1 = QList<int>::const_iterator::operator!=(&local_90,o), bVar1) {
      QList<int>::const_iterator::operator*(&local_90);
      QPoint::QPoint(this,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_fffffffffffffe70),(QPoint *)__first_00.i,
                   (QSize *)in_RDI.i);
      QList<QRect>::operator<<
                ((QList<QRect> *)this,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QList<int>::const_iterator::operator++(&local_90);
    }
    QList<int>::const_iterator::operator++(&local_78);
  }
  QList<int>::~QList((QList<int> *)0x60d1ed);
  QList<int>::~QList((QList<int> *)0x60d1fa);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QRect> *)(QPoint *)__first_00.i;
}

Assistant:

QList<QRect> MinOverlapPlacer::getCandidatePlacements(const QSize &size, const QList<QRect> &rects,
                                                      const QRect &domain)
{
    QList<QRect> result;

    QList<int> xlist;
    xlist.reserve(2 + rects.size());
    xlist << domain.left() << domain.right() - size.width() + 1;

    QList<int> ylist;
    ylist.reserve(2 + rects.size());
    ylist << domain.top();
    if (domain.bottom() - size.height() + 1 >= 0)
        ylist << domain.bottom() - size.height() + 1;

    for (const QRect &rect : rects) {
        xlist << rect.right() + 1;
        ylist << rect.bottom() + 1;
    }

    std::sort(xlist.begin(), xlist.end());
    xlist.erase(std::unique(xlist.begin(), xlist.end()), xlist.end());

    std::sort(ylist.begin(), ylist.end());
    ylist.erase(std::unique(ylist.begin(), ylist.end()), ylist.end());

    result.reserve(ylist.size() * xlist.size());
    for (int y : std::as_const(ylist))
        for (int x : std::as_const(xlist))
            result << QRect(QPoint(x, y), size);
    return result;
}